

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

bool __thiscall embree::XMLLoader::load<bool>(XMLLoader *this,Ref<embree::XML> *xml,bool *opt)

{
  int iVar1;
  size_type sVar2;
  runtime_error *this_00;
  byte *in_RDX;
  long *in_RSI;
  ParseLocation *in_stack_00000008;
  char *__rhs;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff6c;
  string local_68 [24];
  Token *in_stack_ffffffffffffffb0;
  bool local_21;
  
  if (*in_RSI == 0) {
    local_21 = (bool)(*in_RDX & 1);
  }
  else {
    sVar2 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                      ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RSI + 0x98));
    if (sVar2 != 1) {
      uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff68);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      __rhs = (char *)*in_RSI;
      ParseLocation::str_abi_cxx11_(in_stack_00000008);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff6c,uVar3),__rhs);
      std::runtime_error::runtime_error(this_00,local_68);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RSI + 0x98),0);
    iVar1 = Token::Int(in_stack_ffffffffffffffb0);
    local_21 = iVar1 != 0;
  }
  return local_21;
}

Assistant:

bool XMLLoader::load<bool>(const Ref<XML>& xml, const bool& opt) {
    if (xml == null) return opt;
    if (xml->body.size() != 1) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong bool body");
    return xml->body[0].Int() != 0;
  }